

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLayout.cpp
# Opt level: O3

void __thiscall SimpleLayout::Layout(SimpleLayout *this)

{
  IRKind IVar1;
  OpCode OVar2;
  LabelInstr *pLVar3;
  PragmaInstr *pPVar4;
  code *pcVar5;
  bool bVar6;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar7;
  BranchInstr *pBVar8;
  Instr *pIVar9;
  BranchInstr *pBVar10;
  Func *pFVar11;
  LabelInstr *nextLabel;
  LabelInstr *pLVar12;
  LabelInstr *pLVar13;
  Func *local_50;
  Instr *local_48;
  uint32 local_34;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,LayoutPhase,sourceContextId,functionId);
  if ((!bVar6) &&
     (bVar6 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar6)) {
    pFVar11 = this->func;
    local_48 = pFVar11->m_tailInstr;
    if (local_48->m_prev == (Instr *)0x0) {
      pLVar13 = (LabelInstr *)0x0;
    }
    else {
      pLVar13 = (LabelInstr *)local_48->m_prev->m_next;
    }
    nextLabel = (LabelInstr *)pFVar11->m_headInstr;
    if (nextLabel != pLVar13) {
      local_34 = 0xffffffff;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pLVar12 = (LabelInstr *)0x0;
      local_50 = (Func *)0x0;
      do {
        pLVar3 = (LabelInstr *)(nextLabel->super_Instr).m_next;
        IVar1 = (nextLabel->super_Instr).m_kind;
        if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
          if ((nextLabel->field_0x78 & 2) == 0) {
            if ((pLVar12 == (LabelInstr *)0x0) ||
               (pBVar8 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar12->super_Instr),
               (pBVar8->super_Instr).m_kind != InstrKindBranch)) goto LAB_0062546a;
            if (pBVar8->m_branchTarget == nextLabel) {
              local_48 = MoveHelperBlock(this,&pLVar12->super_Instr,local_34,local_50,nextLabel,
                                         local_48);
              OVar2 = (pBVar8->super_Instr).m_opcode;
              if (OVar2 < ADD) {
                if ((OVar2 != MultiBr) && (OVar2 != Br)) goto LAB_00625582;
              }
              else {
                bVar6 = LowererMD::IsUnconditionalBranch((Instr *)pBVar8);
                if (!bVar6) {
LAB_00625582:
                  LowererMD::InvertBranch(pBVar8);
                  if (pBVar8->m_isMultiBranch == true) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                       ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
                    if (!bVar6) {
                      pcVar5 = (code *)invalidInstructionException();
                      (*pcVar5)();
                    }
                    *puVar7 = 0;
                  }
                  if (pBVar8->m_branchTarget != (LabelInstr *)0x0) {
                    IR::LabelInstr::RemoveLabelRef(pBVar8->m_branchTarget,pBVar8);
                  }
                  IR::LabelInstr::AddLabelRef(pLVar12,pBVar8);
                  pBVar8->m_branchTarget = pLVar12;
                  goto LAB_0062546a;
                }
              }
LAB_006256f4:
              IR::Instr::Remove((Instr *)pBVar8);
            }
            else {
              OVar2 = (pBVar8->super_Instr).m_opcode;
              if (OVar2 < ADD) {
                if ((OVar2 == MultiBr) || (OVar2 == Br)) goto LAB_00625533;
              }
              else {
                bVar6 = LowererMD::IsUnconditionalBranch((Instr *)pBVar8);
                if (bVar6) {
LAB_00625533:
                  pIVar9 = IR::Instr::GetPrevRealInstrOrLabel((Instr *)pBVar8);
                  if (pIVar9->m_kind == InstrKindBranch) {
                    OVar2 = pIVar9->m_opcode;
                    if (OVar2 < ADD) {
                      if ((OVar2 != Br) && (OVar2 != MultiBr)) goto LAB_00625613;
                    }
                    else {
                      bVar6 = LowererMD::IsUnconditionalBranch(pIVar9);
                      if (!bVar6) {
LAB_00625613:
                        pBVar10 = IR::Instr::AsBranchInstr(pIVar9);
                        if (pBVar10->m_branchTarget == nextLabel) {
                          local_48 = MoveHelperBlock(this,&pLVar12->super_Instr,local_34,local_50,
                                                     nextLabel,local_48);
                          pBVar10 = IR::Instr::AsBranchInstr(pIVar9);
                          LowererMD::InvertBranch(pBVar10);
                          pBVar10 = IR::Instr::AsBranchInstr(pIVar9);
                          IR::BranchInstr::SetTarget(pBVar10,pBVar8->m_branchTarget);
                          goto LAB_006256f4;
                        }
                      }
                    }
                  }
                  pIVar9 = IR::Instr::GetPrevRealInstr(&nextLabel->super_Instr);
                  if (pIVar9->m_kind == InstrKindBranch) {
                    local_48 = MoveHelperBlock(this,&pLVar12->super_Instr,local_34,local_50,
                                               nextLabel,local_48);
                    OVar2 = pIVar9->m_opcode;
                    if (OVar2 < ADD) {
                      if ((OVar2 != Br) && (OVar2 != MultiBr)) goto LAB_0062568a;
                    }
                    else {
                      bVar6 = LowererMD::IsUnconditionalBranch(pIVar9);
                      if (!bVar6) {
LAB_0062568a:
                        pBVar8 = IR::BranchInstr::New(JMP,nextLabel,this->func);
                        IR::Instr::InsertAfter(pIVar9,&pBVar8->super_Instr);
                      }
                    }
                  }
                }
              }
            }
LAB_0062546a:
            pLVar12 = (LabelInstr *)0x0;
          }
          else if (pLVar12 == (LabelInstr *)0x0) {
            pPVar4 = this->currentStatement;
            pLVar12 = nextLabel;
            if (pPVar4 == (PragmaInstr *)0x0) {
              local_34 = 0xffffffff;
              local_50 = (Func *)0x0;
            }
            else {
              local_34 = pPVar4->m_statementIndex;
              local_50 = (pPVar4->super_Instr).m_func;
            }
          }
        }
        else if ((IVar1 == InstrKindPragma) &&
                ((nextLabel->super_Instr).m_opcode == StatementBoundary)) {
          this->currentStatement = (PragmaInstr *)nextLabel;
        }
        nextLabel = pLVar3;
      } while (pLVar3 != pLVar13);
      pFVar11 = this->func;
    }
    pFVar11->m_tailInstr = local_48;
  }
  return;
}

Assistant:

void
SimpleLayout::Layout()
{
    if (PHASE_OFF(Js::LayoutPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag))
    {
        return;
    }

    // Do simple layout of helper block.  Push them to after FunctionExit.

    IR::Instr * lastInstr = func->m_tailInstr;
    IR::LabelInstr * lastOpHelperLabel = NULL;
    uint32 lastOpHelperStatementIndex = Js::Constants::NoStatementIndex;
    Func* lastOpHelperFunc = nullptr;
    FOREACH_INSTR_EDITING_IN_RANGE(instr, instrNext, func->m_headInstr, func->m_tailInstr->m_prev)
    {
        if (instr->IsPragmaInstr() && instr->m_opcode == Js::OpCode::StatementBoundary)
        {
            currentStatement = instr->AsPragmaInstr();
        }
        else if (instr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = instr->AsLabelInstr();
            if (labelInstr->isOpHelper)
            {
                if (lastOpHelperLabel == NULL)
                {
                    lastOpHelperLabel = labelInstr;
                    lastOpHelperStatementIndex = currentStatement ? currentStatement->m_statementIndex : Js::Constants::NoStatementIndex;
                    lastOpHelperFunc = currentStatement ? currentStatement->m_func : nullptr;
                }
            }
            else if (lastOpHelperLabel != NULL)
            {
                IR::Instr * prevInstr = lastOpHelperLabel->GetPrevRealInstrOrLabel();
                if (prevInstr->IsBranchInstr())
                {
                    // If the previous instruction is to jump around this helper block
                    // Then we move the helper block to the end of the function to
                    // avoid the jmp in the fast path.

                    //      jxx $label          <== prevInstr
                    // $helper:                 <== lastOpHelperLabel
                    //      ...
                    //      ...                 <== lastOpHelperInstr
                    // $label:                  <== labelInstr

                    IR::BranchInstr * prevBranchInstr = prevInstr->AsBranchInstr();
                    if (prevBranchInstr->GetTarget() == labelInstr)
                    {
                        lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);


                        if (prevBranchInstr->IsUnconditional())
                        {
                            // Remove the branch to next after the helper block is moved.
                            prevBranchInstr->Remove();
                        }
                        else
                        {
                            // Reverse the condition
                            LowererMD::InvertBranch(prevBranchInstr);
                            prevBranchInstr->SetTarget(lastOpHelperLabel);
                        }
                    }
                    else if (prevBranchInstr->IsUnconditional())
                    {
                        IR::Instr * prevPrevInstr = prevInstr->GetPrevRealInstrOrLabel();
                        if (prevPrevInstr->IsBranchInstr()
                            && prevPrevInstr->AsBranchInstr()->IsConditional()
                            && prevPrevInstr->AsBranchInstr()->GetTarget() == labelInstr)
                        {

                            //      jcc $label          <== prevPrevInstr
                            //      jmp $blah           <== prevInstr
                            // $helper:                 <== lastOpHelperLabel
                            //      ...
                            //      ...                 <== lastOpHelperInstr
                            // $label:                  <== labelInstr

                            // Transform to

                            //      jncc $blah          <== prevPrevInstr
                            // $label:                  <== labelInstr

                            // $helper:                 <== lastOpHelperLabel
                            //      ...
                            //      ...                 <== lastOpHelperInstr
                            //      jmp $label:         <== labelInstr

                            lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);

                            LowererMD::InvertBranch(prevPrevInstr->AsBranchInstr());
                            prevPrevInstr->AsBranchInstr()->SetTarget(prevBranchInstr->GetTarget());
                            prevBranchInstr->Remove();
                        }
                        else
                        {
                            IR::Instr *lastOpHelperInstr = labelInstr->GetPrevRealInstr();
                            if (lastOpHelperInstr->IsBranchInstr())
                            {
                                IR::BranchInstr *lastOpHelperBranchInstr = lastOpHelperInstr->AsBranchInstr();

                                //      jmp $target         <== prevInstr           //this is unconditional jump
                                // $helper:                 <== lastOpHelperLabel
                                //      ...
                                //      jmp $labeln         <== lastOpHelperInstr   //Conditional/Unconditional jump
                                // $label:                  <== labelInstr

                                lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);
                                //Compensation code if its not unconditional jump
                                if (!lastOpHelperBranchInstr->IsUnconditional())
                                {
                                    IR::BranchInstr *branchInstr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelInstr, this->func);
                                    lastOpHelperBranchInstr->InsertAfter(branchInstr);
                                }
                            }

                        }
                    }
                }
                lastOpHelperLabel = NULL;
            }
        }
    }
    NEXT_INSTR_EDITING_IN_RANGE;

    func->m_tailInstr = lastInstr;
}